

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::IsFortranBuildingInstrinsicModules(cmGeneratorTarget *this)

{
  byte bVar1;
  cmValue cVar2;
  cmValue prop;
  allocator<char> local_39;
  cmValue local_38;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Fortran_BUILDING_INSTRINSIC_MODULES",&local_39);
  cVar2 = GetProperty(this,&local_30);
  local_38 = cVar2;
  bVar1 = std::__cxx11::string::~string((string *)&local_30);
  if (cVar2.Value != (string *)0x0) {
    bVar1 = cmValue::IsOn(&local_38);
  }
  return (bool)(cVar2.Value != (string *)0x0 & bVar1);
}

Assistant:

bool cmGeneratorTarget::IsFortranBuildingInstrinsicModules() const
{
  if (cmValue prop =
        this->GetProperty("Fortran_BUILDING_INSTRINSIC_MODULES")) {
    return prop.IsOn();
  }
  return false;
}